

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_S2C_RESPONSE(void)

{
  uint len;
  uint uVar1;
  uchar *buf;
  PipeMsg newmsg;
  PipeMsg msg;
  
  buf = (uchar *)operator_new__(0x40000);
  MsgHelper::initMsg(&msg,S2C_RESPONSE);
  msg.field_1.c2s_request.CMD = '\x02';
  len = MsgHelper::serializeMsg(&msg,buf);
  printHex(buf,len);
  uVar1 = MsgHelper::deserializeMsg(buf,0x40000,&newmsg);
  printf("len = %d, newlen = %d\n",(ulong)len,(ulong)uVar1);
  if (uVar1 == len) {
    MsgHelper::printMsg(&msg);
    MsgHelper::printMsg(&newmsg);
    MsgHelper::destroyMsg(&msg);
    MsgHelper::destroyMsg(&newmsg);
    operator_delete__(buf);
    return;
  }
  __assert_fail("newlen == len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0xab,"void test_S2C_RESPONSE()");
}

Assistant:

void test_S2C_RESPONSE()
{
	uint8_t *buf = new uint8_t[MSG_MAX_SIZE];
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::S2C_RESPONSE);
	msg.s2c_response.CODE = S2C_RESPONSE_CODE::TCP_TIME_OUT;
	
	uint32_t len = MsgHelper::serializeMsg(&msg, buf);
	printHex(buf, len);
	
	PipeMsg newmsg;
	uint32_t newlen = MsgHelper::deserializeMsg(buf, MSG_MAX_SIZE, &newmsg);

	printf("len = %d, newlen = %d\n", len, newlen);
	assert(newlen == len);
	
	
	MsgHelper::printMsg(&msg);
	MsgHelper::printMsg(&newmsg);	
	MsgHelper::destroyMsg(&msg);
	MsgHelper::destroyMsg(&newmsg);
	
	delete[]buf;
}